

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int windowExprGtZero(Parse *pParse,Expr *pExpr)

{
  int iVar1;
  sqlite3_value *local_30;
  sqlite3_value *pVal;
  sqlite3 *db;
  Expr *pEStack_18;
  int ret;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  db._4_4_ = 0;
  pVal = (sqlite3_value *)pParse->db;
  local_30 = (sqlite3_value *)0x0;
  pEStack_18 = pExpr;
  pExpr_local = (Expr *)pParse;
  sqlite3ValueFromExpr((sqlite3 *)pVal,pExpr,((sqlite3 *)pVal)->enc,'C',&local_30);
  if (local_30 != (sqlite3_value *)0x0) {
    iVar1 = sqlite3_value_int(local_30);
    if (0 < iVar1) {
      db._4_4_ = 1;
    }
  }
  sqlite3ValueFree(local_30);
  return db._4_4_;
}

Assistant:

static int windowExprGtZero(Parse *pParse, Expr *pExpr){
  int ret = 0;
  sqlite3 *db = pParse->db;
  sqlite3_value *pVal = 0;
  sqlite3ValueFromExpr(db, pExpr, db->enc, SQLITE_AFF_NUMERIC, &pVal);
  if( pVal && sqlite3_value_int(pVal)>0 ){
    ret = 1;
  }
  sqlite3ValueFree(pVal);
  return ret;
}